

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn3s.cc
# Opt level: O1

void __thiscall trng::yarn3s::yarn3s(yarn3s *this,unsigned_long s,parameter_type P)

{
  int iVar1;
  int iVar2;
  
  *(long *)(this->P).a = P.a._0_8_;
  iVar1 = (int)((long)s % 0x7fffadb3);
  iVar2 = iVar1 + 0x7fffadb3;
  if (-1 < (long)s % 0x7fffadb3) {
    iVar2 = iVar1;
  }
  (this->P).a[2] = P.a[2];
  (this->S).r[0] = iVar2;
  (this->S).r[1] = 1;
  (this->S).r[2] = 1;
  return;
}

Assistant:

yarn3s::yarn3s(unsigned long s, yarn3s::parameter_type P) : P{P} { seed(s); }